

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

void __thiscall
bsim::quad_value_bit_vector::quad_value_bit_vector(quad_value_bit_vector *this,int N_,int val)

{
  undefined4 in_ESI;
  long in_RDI;
  int i;
  undefined7 in_stack_ffffffffffffffb8;
  uchar in_stack_ffffffffffffffbf;
  int in_stack_ffffffffffffffc0;
  int iVar1;
  int in_stack_ffffffffffffffc4;
  size_type in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe4;
  
  std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::vector
            ((vector<bsim::quad_value,_std::allocator<bsim::quad_value>_> *)0x23eb48);
  *(undefined4 *)(in_RDI + 0x18) = in_ESI;
  std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::resize
            ((vector<bsim::quad_value,_std::allocator<bsim::quad_value>_> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8
            );
  iVar1 = 0;
  while (iVar1 < *(int *)(in_RDI + 0x18)) {
    iVar2 = iVar1;
    if (iVar1 < 0x20) {
      quad_value::quad_value
                ((quad_value *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbf);
      in_stack_ffffffffffffffc4 = iVar1;
      set((quad_value_bit_vector *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),0,
          (quad_value)(uchar)((uint)iVar1 >> 0x18));
      iVar1 = in_stack_ffffffffffffffc0;
    }
    else {
      quad_value::quad_value
                ((quad_value *)CONCAT44(in_stack_ffffffffffffffc4,iVar1),in_stack_ffffffffffffffbf);
      set((quad_value_bit_vector *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),0,
          (quad_value)(uchar)((uint)in_stack_ffffffffffffffc4 >> 0x18));
    }
    in_stack_ffffffffffffffc0 = iVar1;
    iVar1 = iVar2 + 1;
  }
  return;
}

Assistant:

quad_value_bit_vector(const int N_, const int val) : N(N_) {
      //bits.resize(NUM_BYTES(N));
      bits.resize(N);

      for (int i = 0; i < N; i++) {
        if (i < ((int) sizeof(int)*8)) {
          set(i, quad_value((val >> i) & 0x01));
        } else {
          set(i, quad_value(0));
        }
      }
    }